

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O0

int xmlAutomataNewCounter(xmlAutomataPtr am,int min,int max)

{
  int ret;
  int max_local;
  int min_local;
  xmlAutomataPtr am_local;
  
  if (am == (xmlAutomataPtr)0x0) {
    am_local._4_4_ = -1;
  }
  else {
    am_local._4_4_ = xmlRegGetCounter(am);
    if (am_local._4_4_ < 0) {
      am_local._4_4_ = -1;
    }
    else {
      am->counters[am_local._4_4_].min = min;
      am->counters[am_local._4_4_].max = max;
    }
  }
  return am_local._4_4_;
}

Assistant:

int
xmlAutomataNewCounter(xmlAutomataPtr am, int min, int max) {
    int ret;

    if (am == NULL)
	return(-1);

    ret = xmlRegGetCounter(am);
    if (ret < 0)
	return(-1);
    am->counters[ret].min = min;
    am->counters[ret].max = max;
    return(ret);
}